

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

int __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::shutdown(ConnectionImpl *this,int __fd,int __how)

{
  undefined4 in_register_00000034;
  ConnectionImpl *pCVar1;
  Type local_1e0;
  ConnectionImpl *local_1d8;
  ConnectionImpl *p;
  ConnectionImpl *_p452;
  Exception local_1b8;
  Exception *local_28;
  Exception *e;
  Exception *_e449;
  ConnectionImpl *this_local;
  
  pCVar1 = (ConnectionImpl *)CONCAT44(in_register_00000034,__fd);
  _e449 = (Exception *)pCVar1;
  this_local = this;
  local_28 = kj::_::readMaybe<kj::Exception>(&pCVar1->vat->shutdownExceptionToThrow);
  e = local_28;
  if (local_28 == (Exception *)0x0) {
    local_1d8 = kj::_::readMaybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl>
                          (&pCVar1->partner);
    p = local_1d8;
    if (local_1d8 == (ConnectionImpl *)0x0) {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
    else if ((local_1d8->initiatedIdleShutdown & 1U) == 0) {
      local_1e0.this = pCVar1;
      kj::
      evalLater<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::shutdown()::_lambda()_1_>
                ((kj *)this,&local_1e0);
    }
    else {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
  }
  else {
    kj::cp<kj::Exception>(&local_1b8,local_28);
    kj::Promise<void>::Promise((Promise<void> *)this,&local_1b8);
    kj::Exception::~Exception(&local_1b8);
  }
  return (int)this;
}

Assistant:

kj::Promise<void> shutdown() override {
      KJ_IF_SOME(e, vat.shutdownExceptionToThrow) {
        return kj::cp(e);
      }
      KJ_IF_SOME(p, partner) {
        if (p.initiatedIdleShutdown) {
          // Partner already initiated shutdown so don't wait for it to call
          // receiveIncomingMessage() again (it won't).
          return kj::READY_NOW;
        }

        // Make sure partner receives EOF. We have to evalLater() because
        // OutgoingMessageImpl::send() also does that and we need to deliver in order.
        return kj::evalLater([this]() -> kj::Promise<void> {
          KJ_IF_SOME(p, partner) {
            p.messageQueue.push(kj::none);
            auto paf = kj::newPromiseAndFulfiller<void>();
            p.fulfillOnEnd = kj::mv(paf.fulfiller);
            return kj::mv(paf.promise);
          } else {
            return kj::READY_NOW;
          }
        });
      } else {
        return kj::READY_NOW;
      }
    }